

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result_conflict *
CoreML::validateLSTMWeightParams
          (Result_conflict *__return_storage_ptr__,LSTMWeightParams *lstmWeightParams,
          LSTMParams *lstmParams)

{
  bool bVar1;
  WeightParams *pWVar2;
  allocator local_b1;
  undefined1 local_b0 [8];
  string err;
  WeightParamType local_80;
  WeightParamType local_7c;
  WeightParamType local_78;
  WeightParamType local_74;
  WeightParamType local_70;
  WeightParamType local_6c;
  WeightParamType local_68;
  WeightParamType local_64;
  WeightParamType local_60;
  WeightParamType local_5c;
  WeightParamType local_58 [5];
  WeightParamType local_44;
  undefined1 local_40 [8];
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypes;
  bool has_bias_vector;
  bool has_peephole_vector;
  LSTMParams *lstmParams_local;
  LSTMWeightParams *lstmWeightParams_local;
  
  weightTypes.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       Specification::LSTMParams::haspeepholevectors(lstmParams);
  weightTypes.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
       Specification::LSTMParams::hasbiasvectors(lstmParams);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::vector
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40);
  pWVar2 = Specification::LSTMWeightParams::inputgateweightmatrix(lstmWeightParams);
  local_44 = valueType(pWVar2);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40,
             &local_44);
  pWVar2 = Specification::LSTMWeightParams::forgetgateweightmatrix(lstmWeightParams);
  local_58[0] = valueType(pWVar2);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40,
             local_58);
  pWVar2 = Specification::LSTMWeightParams::blockinputweightmatrix(lstmWeightParams);
  local_5c = valueType(pWVar2);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40,
             &local_5c);
  pWVar2 = Specification::LSTMWeightParams::outputgateweightmatrix(lstmWeightParams);
  local_60 = valueType(pWVar2);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40,
             &local_60);
  pWVar2 = Specification::LSTMWeightParams::inputgaterecursionmatrix(lstmWeightParams);
  local_64 = valueType(pWVar2);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40,
             &local_64);
  pWVar2 = Specification::LSTMWeightParams::forgetgaterecursionmatrix(lstmWeightParams);
  local_68 = valueType(pWVar2);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40,
             &local_68);
  pWVar2 = Specification::LSTMWeightParams::blockinputrecursionmatrix(lstmWeightParams);
  local_6c = valueType(pWVar2);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40,
             &local_6c);
  pWVar2 = Specification::LSTMWeightParams::outputgaterecursionmatrix(lstmWeightParams);
  local_70 = valueType(pWVar2);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40,
             &local_70);
  if ((weightTypes.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
    pWVar2 = Specification::LSTMWeightParams::inputgatebiasvector(lstmWeightParams);
    local_74 = valueType(pWVar2);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40
               ,&local_74);
    pWVar2 = Specification::LSTMWeightParams::forgetgatebiasvector(lstmWeightParams);
    local_78 = valueType(pWVar2);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40
               ,&local_78);
    pWVar2 = Specification::LSTMWeightParams::blockinputbiasvector(lstmWeightParams);
    local_7c = valueType(pWVar2);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40
               ,&local_7c);
    pWVar2 = Specification::LSTMWeightParams::outputgatebiasvector(lstmWeightParams);
    local_80 = valueType(pWVar2);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40
               ,&local_80);
  }
  if ((weightTypes.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    pWVar2 = Specification::LSTMWeightParams::inputgatepeepholevector(lstmWeightParams);
    err._M_storage._M_storage._4_4_ = valueType(pWVar2);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40
               ,(value_type *)(err._M_storage._M_storage + 4));
    pWVar2 = Specification::LSTMWeightParams::forgetgatepeepholevector(lstmWeightParams);
    err._M_storage._M_storage._0_4_ = valueType(pWVar2);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40
               ,(value_type *)&err._M_storage);
    pWVar2 = Specification::LSTMWeightParams::outputgatepeepholevector(lstmWeightParams);
    err.super__Rb_tree_node_base._M_right._4_4_ = valueType(pWVar2);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40
               ,(value_type *)((long)&err.super__Rb_tree_node_base._M_right + 4));
  }
  bVar1 = isWeightParamTypeCompatible
                    ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)
                     local_40);
  if (bVar1) {
    Result::Result((Result *)__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_b0,
               "LSTM weight parameters have inconsistent field value types. Types should match and should be either half or full precision"
               ,&local_b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
  }
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::~vector
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateLSTMWeightParams(const Specification::LSTMWeightParams& lstmWeightParams, const Specification::LSTMParams lstmParams) {
    bool has_peephole_vector = lstmParams.haspeepholevectors();
    bool has_bias_vector = lstmParams.hasbiasvectors();
    
    // Validate all weightParam types match
    std::vector<CoreML::WeightParamType> weightTypes;
    weightTypes.push_back(valueType(lstmWeightParams.inputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.inputgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputrecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgaterecursionmatrix()));
    if(has_bias_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.blockinputbiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatebiasvector()));
    }
    if(has_peephole_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatepeepholevector()));
    }
    if(!isWeightParamTypeCompatible(weightTypes)){
        const std::string err = "LSTM weight parameters have inconsistent field value types. "
        "Types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}